

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O2

void __thiscall
iDynTree::InverseKinematics::setLinearSolverName(InverseKinematics *this,string *solverName)

{
  iDynTree::reportError
            ("InverseKinematics","",
             "IDYNTREE_USES_IPOPT CMake option need to be set to ON to use InverseKinematics");
  return;
}

Assistant:

void InverseKinematics::setLinearSolverName(const std::string &solverName)
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        IK_PIMPL(m_pimpl)->m_solverName = solverName;
#else
        missingIpoptErrorReport();
#endif
    }